

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr * __thiscall c4::yml::Tree::key_anchor(Tree *this,size_t node)

{
  NodeType_e NVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  csubstr *pcVar5;
  
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar2)();
        return pcVar5;
      }
    }
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  NVar1 = this->m_buf[node].m_type.type;
  uVar4 = (uint)NVar1;
  if ((NVar1 & KEYREF) == NOTYPE) {
    if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          pcVar2 = (code *)swi(3);
          pcVar5 = (csubstr *)(*pcVar2)();
          return pcVar5;
        }
      }
      (*(code *)PTR_error_impl_0023b518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      uVar4 = (uint)this->m_buf[node].m_type.type;
    }
    if ((~uVar4 & 0x102) == 0) goto LAB_001e7db7;
  }
  if (((byte)s_error_flags & 1) != 0) {
    bVar3 = is_debugger_attached();
    if (bVar3) {
      pcVar2 = (code *)swi(3);
      pcVar5 = (csubstr *)(*pcVar2)();
      return pcVar5;
    }
  }
  (*(code *)PTR_error_impl_0023b518)
            ("check failed: ! is_key_ref(node) && has_key_anchor(node)",0x38,
             (anonymous_namespace)::s_default_callbacks);
LAB_001e7db7:
  if ((node == 0xffffffffffffffff) || (this->m_cap <= node)) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar2 = (code *)swi(3);
        pcVar5 = (csubstr *)(*pcVar2)();
        return pcVar5;
      }
    }
    (*(code *)PTR_error_impl_0023b518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  return &this->m_buf[node].m_key.anchor;
}

Assistant:

csubstr    const& key_anchor(size_t node) const { RYML_ASSERT( ! is_key_ref(node) && has_key_anchor(node)); return _p(node)->m_key.anchor; }